

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_page_element *__s;
  nk_page *pnVar1;
  uint uVar2;
  nk_page_element *__s_00;
  size_t __n;
  size_t __n_00;
  
  __s = ctx->freelist;
  if (__s != (nk_page_element *)0x0) {
    ctx->freelist = __s->next;
    goto LAB_00143be8;
  }
  if (ctx->use_pool == 0) {
    __s = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x200,8);
    if (__s == (nk_page_element *)0x0) {
      __assert_fail("elem",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3bc3,"struct nk_page_element *nk_create_page_element(struct nk_context *)");
    }
    goto LAB_00143be8;
  }
  pnVar1 = (ctx->pool).pages;
  if (pnVar1 == (nk_page *)0x0) {
    if ((ctx->pool).type == NK_BUFFER_FIXED) {
      __assert_fail("pool->pages",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3b99,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
    }
LAB_00143ba6:
    uVar2 = 0;
    pnVar1 = (nk_page *)(*(ctx->pool).alloc.alloc)((ctx->pool).alloc.userdata,(void *)0x0,0x2110);
    pnVar1->next = (ctx->pool).pages;
    (ctx->pool).pages = pnVar1;
    pnVar1->size = 0;
  }
  else {
    uVar2 = pnVar1->size;
    if ((ctx->pool).capacity <= uVar2) {
      if ((ctx->pool).type == NK_BUFFER_FIXED) {
        __assert_fail("pool->pages->size < pool->capacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3b9b,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
      }
      goto LAB_00143ba6;
    }
  }
  pnVar1->size = uVar2 + 1;
  __s = pnVar1->win + uVar2;
LAB_00143be8:
  __n = (ulong)__s & 3;
  if (__n == 0) {
    __n = 0x1f0;
    __s_00 = __s;
  }
  else {
    __n_00 = -__n + 4;
    memset(__s,0,__n_00);
    memset((void *)((long)__s + __n_00),0,0x1fc);
    __s_00 = (nk_page_element *)((long)__s + -__n + 0x200);
  }
  memset(__s_00,0,__n);
  __s->next = (nk_page_element *)0x0;
  __s->prev = (nk_page_element *)0x0;
  return __s;
}

Assistant:

NK_LIB struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    if (ctx->freelist) {
        /* unlink page element from free list */
        elem = ctx->freelist;
        ctx->freelist = elem->next;
    } else if (ctx->use_pool) {
        /* allocate page element from memory pool */
        elem = nk_pool_alloc(&ctx->pool);
        NK_ASSERT(elem);
        if (!elem) return 0;
    } else {
        /* allocate new page element from back of fixed size memory buffer */
        NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
        NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
        elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
        NK_ASSERT(elem);
        if (!elem) return 0;
    }
    nk_zero_struct(*elem);
    elem->next = 0;
    elem->prev = 0;
    return elem;
}